

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::SpecparamSymbol::getValue(SpecparamSymbol *this,SourceRange referencingRange)

{
  DeclaredType *this_00;
  Scope *pSVar1;
  Compilation *pCVar2;
  SyntaxNode *pSVar3;
  Type *lhs;
  Diagnostic *pDVar4;
  Expression *pEVar5;
  ConstantValue *pCVar6;
  Type *this_01;
  TypedBumpAllocator<slang::ConstantValue> *this_02;
  LookupLocation LVar7;
  SourceRange SVar8;
  SourceRange assignmentRange;
  ASTContext ctx;
  undefined8 in_stack_ffffffffffffff78;
  ASTContext local_60;
  
  if (this->value1 != (ConstantValue *)0x0) {
    return this->value1;
  }
  pSVar1 = (this->super_ValueSymbol).super_Symbol.parentScope;
  LVar7 = LookupLocation::before((Symbol *)this);
  local_60.lookupIndex = LVar7.index;
  local_60.flags.m_bits = 0x800000000;
  local_60.instanceOrProc = (Symbol *)0x0;
  local_60.firstTempVar = (TempVarSymbol *)0x0;
  local_60.randomizeDetails = (RandomizeDetails *)0x0;
  local_60.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_60.scope.ptr = pSVar1;
  if (this->evaluating != false) {
    pDVar4 = ASTContext::addDiag(&local_60,(DiagCode)0x17000c,
                                 (this->super_ValueSymbol).super_Symbol.location);
    pDVar4 = Diagnostic::operator<<(pDVar4,(this->super_ValueSymbol).super_Symbol.name);
    Diagnostic::addNote(pDVar4,(DiagCode)0xd0001,referencingRange);
    return (ConstantValue *)ConstantValue::Invalid;
  }
  this->evaluating = true;
  this_00 = &(this->super_ValueSymbol).declaredType;
  pEVar5 = DeclaredType::getInitializer(this_00);
  if (pEVar5 == (Expression *)0x0) {
    this->value1 = (ConstantValue *)ConstantValue::Invalid;
  }
  else {
    pCVar2 = pSVar1->compilation;
    ASTContext::eval((ConstantValue *)&stack0xffffffffffffff78,&local_60,pEVar5,
                     (bitmask<slang::ast::EvalFlags>)0x0);
    this_02 = &pCVar2->constantAllocator;
    pCVar6 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                       (this_02,(ConstantValue *)&stack0xffffffffffffff78);
    this->value1 = pCVar6;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&stack0xffffffffffffff78);
    pSVar3 = (this->super_ValueSymbol).super_Symbol.originatingSyntax;
    lhs = *(Type **)(pSVar3 + 4);
    if (lhs != (Type *)0x0) {
      this_01 = DeclaredType::getType(this_00);
      SVar8 = parsing::Token::range((Token *)&pSVar3[1].previewNode);
      assignmentRange.endLoc = (SourceLocation)&local_60;
      assignmentRange.startLoc = SVar8.endLoc;
      pEVar5 = Expression::bindRValue
                         ((Expression *)this_01,lhs,(ExpressionSyntax *)SVar8.startLoc,
                          assignmentRange,(ASTContext *)0x0,
                          (bitmask<slang::ast::ASTFlags>)in_stack_ffffffffffffff78);
      ASTContext::eval((ConstantValue *)&stack0xffffffffffffff78,&local_60,pEVar5,
                       (bitmask<slang::ast::EvalFlags>)0x0);
      pCVar6 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                         (this_02,(ConstantValue *)&stack0xffffffffffffff78);
      this->value2 = pCVar6;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&stack0xffffffffffffff78);
      goto LAB_003541b1;
    }
  }
  this->value2 = (ConstantValue *)ConstantValue::Invalid;
LAB_003541b1:
  this->evaluating = false;
  return this->value1;
}

Assistant:

const ConstantValue& SpecparamSymbol::getValue(SourceRange referencingRange) const {
    if (!value1) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        ASTContext ctx(*scope, LookupLocation::before(*this), ASTFlags::SpecparamInitializer);

        if (evaluating) {
            SLANG_ASSERT(referencingRange.start());

            auto& diag = ctx.addDiag(diag::ConstEvalParamCycle, location) << name;
            diag.addNote(diag::NoteReferencedHere, referencingRange);
            return ConstantValue::Invalid;
        }

        evaluating = true;
        auto guard = ScopeGuard([this] { evaluating = false; });

        // If no value has been explicitly set, try to set it
        // from our initializer.
        auto init = getInitializer();
        if (init) {
            auto& comp = scope->getCompilation();
            value1 = comp.allocConstant(ctx.eval(*init));

            // Specparams can also be a "PATHPULSE$" which has two values to bind.
            auto syntax = getSyntax();
            SLANG_ASSERT(syntax);

            auto& decl = syntax->as<SpecparamDeclaratorSyntax>();
            if (auto exprSyntax = decl.value2) {
                auto& expr2 = Expression::bindRValue(getType(), *exprSyntax, decl.equals.range(),
                                                     ctx);
                value2 = comp.allocConstant(ctx.eval(expr2));
            }
            else {
                value2 = &ConstantValue::Invalid;
            }
        }
        else {
            value1 = &ConstantValue::Invalid;
            value2 = &ConstantValue::Invalid;
        }
    }
    return *value1;
}